

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O2

RPCHelpMan * finalizepsbt(void)

{
  string name;
  string name_00;
  string m_key_name;
  string m_key_name_00;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_04;
  string description_05;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  long lVar3;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  undefined4 in_stack_fffffffffffff6a8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffff6ac;
  undefined8 in_stack_fffffffffffff6b0;
  undefined8 in_stack_fffffffffffff6b8;
  undefined8 in_stack_fffffffffffff6c0;
  _Manager_type in_stack_fffffffffffff6c8;
  undefined8 in_stack_fffffffffffff6d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff6d8;
  pointer in_stack_fffffffffffff6e8;
  pointer pRVar5;
  pointer in_stack_fffffffffffff6f0;
  pointer pRVar6;
  pointer in_stack_fffffffffffff6f8;
  pointer pRVar7;
  undefined8 in_stack_fffffffffffff700;
  pointer in_stack_fffffffffffff708;
  pointer pRVar8;
  pointer in_stack_fffffffffffff710;
  pointer pRVar9;
  pointer in_stack_fffffffffffff718;
  pointer pRVar10;
  undefined8 in_stack_fffffffffffff720;
  pointer in_stack_fffffffffffff728;
  pointer pRVar11;
  pointer in_stack_fffffffffffff730;
  pointer pRVar12;
  pointer in_stack_fffffffffffff738;
  pointer pRVar13;
  undefined8 in_stack_fffffffffffff740;
  undefined1 in_stack_fffffffffffff748 [16];
  undefined1 in_stack_fffffffffffff758 [52];
  undefined4 in_stack_fffffffffffff78c;
  vector<RPCArg,_std::allocator<RPCArg>_> local_870;
  allocator<char> local_852;
  allocator<char> local_851;
  string local_850;
  string local_830;
  string local_810;
  char *local_7f0;
  size_type local_7e8;
  char local_7e0 [8];
  undefined8 uStack_7d8;
  string local_7d0 [32];
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  RPCResult local_710 [3];
  string local_578 [32];
  string local_558 [32];
  RPCResult local_538;
  RPCArgOptions local_4b0;
  string local_468 [32];
  UniValue local_448;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_3f0;
  string local_390 [32];
  RPCArgOptions local_370;
  string local_328 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_308;
  undefined1 local_2b0;
  string local_2a8 [32];
  RPCArg local_288 [2];
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"finalizepsbt",&local_851);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "Finalize the inputs of a PSBT. If the transaction is fully signed, it will produce a\nnetwork serialized transaction which can be broadcast with sendrawtransaction. Otherwise a PSBT will be\ncreated which has the final_scriptSig and final_scriptWitness fields filled for inputs that are complete.\nImplements the Finalizer and Extractor roles.\n"
             ,&local_852);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a8,"psbt",(allocator<char> *)&stack0xfffffffffffff78f);
  local_308._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2b0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_328,"A base64 string of a PSBT",(allocator<char> *)&stack0xfffffffffffff78e);
  local_370.oneline_description._M_dataplus._M_p = (pointer)&local_370.oneline_description.field_2;
  local_370.skip_type_check = false;
  local_370.oneline_description._M_string_length = 0;
  local_370.oneline_description.field_2._M_local_buf[0] = '\0';
  local_370.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_370.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_370.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_370.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_370._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff6ac;
  name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff6a8;
  name._M_string_length = in_stack_fffffffffffff6b0;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff6b8;
  name.field_2._8_8_ = in_stack_fffffffffffff6c0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff6d0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff6c8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff6d8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff6e8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff6f0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff6f8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff700;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff708;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff710;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff718;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff720;
  description_04._M_string_length = (size_type)in_stack_fffffffffffff730;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff728;
  description_04.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff738;
  description_04.field_2._8_8_ = in_stack_fffffffffffff740;
  opts.oneline_description._M_string_length = in_stack_fffffffffffff758._0_8_;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff758._8_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff758._24_24_;
  opts.hidden = (bool)in_stack_fffffffffffff758[0x30];
  opts.also_positional = (bool)in_stack_fffffffffffff758[0x31];
  opts._66_2_ = in_stack_fffffffffffff758._50_2_;
  opts.skip_type_check = (bool)in_stack_fffffffffffff748[0];
  opts._1_7_ = in_stack_fffffffffffff748._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff748._8_8_;
  opts._68_4_ = in_stack_fffffffffffff78c;
  RPCArg::RPCArg(local_288,name,(Type)local_2a8,fallback,description_04,opts);
  std::__cxx11::string::string<std::allocator<char>>
            (local_390,"extract",(allocator<char> *)&stack0xfffffffffffff78d);
  uVar4 = CONCAT31((int3)((uint)in_stack_fffffffffffff78c >> 8),1);
  UniValue::UniValue<bool,_bool,_true>(&local_448,(bool *)&stack0xfffffffffffff78c);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_3f0,&local_448);
  std::__cxx11::string::string<std::allocator<char>>
            (local_468,
             "If true and the transaction is complete,\n                             extract and return the complete transaction in normal network serialization instead of the PSBT."
             ,(allocator<char> *)&stack0xfffffffffffff78b);
  local_4b0.oneline_description._M_dataplus._M_p = (pointer)&local_4b0.oneline_description.field_2;
  local_4b0.skip_type_check = false;
  local_4b0.oneline_description._M_string_length = 0;
  local_4b0.oneline_description.field_2._M_local_buf[0] = '\0';
  local_4b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_4b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_4b0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_4b0._58_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff6ac;
  name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff6a8;
  name_00._M_string_length = in_stack_fffffffffffff6b0;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff6b8;
  name_00.field_2._8_8_ = in_stack_fffffffffffff6c0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff6d0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff6c8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff6d8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff6e8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff6f0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff6f8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff700;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff708;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff710;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff718;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff720;
  description_05._M_string_length = (size_type)in_stack_fffffffffffff730;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff728;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff738;
  description_05.field_2._8_8_ = in_stack_fffffffffffff740;
  opts_00.oneline_description._M_string_length = in_stack_fffffffffffff758._0_8_;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff758._8_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff758._24_24_;
  opts_00.hidden = (bool)in_stack_fffffffffffff758[0x30];
  opts_00.also_positional = (bool)in_stack_fffffffffffff758[0x31];
  opts_00._66_2_ = in_stack_fffffffffffff758._50_2_;
  opts_00.skip_type_check = (bool)in_stack_fffffffffffff748[0];
  opts_00._1_7_ = in_stack_fffffffffffff748._1_7_;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff748._8_8_;
  opts_00._68_4_ = uVar4;
  RPCArg::RPCArg(local_288 + 1,name_00,(Type)local_390,fallback_00,description_05,opts_00);
  __l._M_len = 2;
  __l._M_array = local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            (&local_870,__l,(allocator_type *)&stack0xfffffffffffff78a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_558,"",(allocator<char> *)&stack0xfffffffffffff76f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_578,"",(allocator<char> *)&stack0xfffffffffffff76e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_730,"psbt",(allocator<char> *)&stack0xfffffffffffff74f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_750,"The base64-encoded partially signed transaction if not extracted",
             (allocator<char> *)&stack0xfffffffffffff74e);
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  auVar1._4_8_ = in_stack_fffffffffffff6b0;
  auVar1._0_4_ = in_stack_fffffffffffff6ac;
  auVar1._12_8_ = in_stack_fffffffffffff6b8;
  auVar1._20_8_ = in_stack_fffffffffffff6c0;
  auVar1._28_4_ = 0;
  description._M_string_length = in_stack_fffffffffffff6d0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff6c8;
  description.field_2 = in_stack_fffffffffffff6d8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff6f0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff6e8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff6f8;
  RPCResult::RPCResult
            (local_710,STR,(string)(auVar1 << 0x20),SUB81(local_730,0),description,inner,true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_770,"hex",(allocator<char> *)&stack0xfffffffffffff727);
  std::__cxx11::string::string<std::allocator<char>>
            (local_790,"The hex-encoded network transaction if extracted",
             (allocator<char> *)&stack0xfffffffffffff726);
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  uVar4 = 0;
  auVar2._4_8_ = in_stack_fffffffffffff6b0;
  auVar2._0_4_ = in_stack_fffffffffffff6ac;
  auVar2._12_8_ = in_stack_fffffffffffff6b8;
  auVar2._20_8_ = in_stack_fffffffffffff6c0;
  auVar2._28_4_ = 0;
  description_00._M_string_length = in_stack_fffffffffffff6d0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff6c8;
  description_00.field_2 = in_stack_fffffffffffff6d8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff6f0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff6e8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff6f8;
  RPCResult::RPCResult
            (local_710 + 1,STR_HEX,(string)(auVar2 << 0x20),SUB81(local_770,0),description_00,
             inner_00,true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7b0,"complete",(allocator<char> *)&stack0xfffffffffffff707);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7d0,"If the transaction has a complete set of signatures",
             (allocator<char> *)&stack0xfffffffffffff706);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff6ac;
  m_key_name._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name._M_string_length = in_stack_fffffffffffff6b0;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff6b8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff6c0;
  description_01._M_string_length = in_stack_fffffffffffff6d0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff6c8;
  description_01.field_2._M_local_buf = in_stack_fffffffffffff6d8._M_local_buf;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(local_710 + 2,BOOL,m_key_name,description_01,inner_01,SUB81(local_7b0,0));
  __l_00._M_len = 3;
  __l_00._M_array = local_710;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff750,__l_00,
             (allocator_type *)&stack0xfffffffffffff6e7);
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff6ac;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar4;
  m_key_name_00._M_string_length = in_stack_fffffffffffff6b0;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff6b8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff6c0;
  description_02._M_string_length = in_stack_fffffffffffff6d0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff6c8;
  description_02.field_2 = in_stack_fffffffffffff6d8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar6;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar5;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar7;
  RPCResult::RPCResult(&local_538,OBJ,m_key_name_00,description_02,inner_02,SUB81(local_558,0));
  result._4_4_ = in_stack_fffffffffffff6ac;
  result.m_type = uVar4;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff6b0;
  result.m_key_name._M_string_length = in_stack_fffffffffffff6b8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff6c0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff6c8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff6d0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff6d8;
  result._64_8_ = pRVar5;
  result.m_description._M_dataplus._M_p = (pointer)pRVar6;
  result.m_description._M_string_length = (size_type)pRVar7;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff700;
  result.m_description.field_2._8_8_ = pRVar8;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar9;
  result.m_cond._M_string_length = (size_type)pRVar10;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff720;
  result.m_cond.field_2._8_8_ = pRVar11;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff770,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_830,"finalizepsbt",(allocator<char> *)&stack0xfffffffffffff6e6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_850,"\"psbt\"",(allocator<char> *)&stack0xfffffffffffff6e5);
  HelpExampleCli(&local_810,&local_830,&local_850);
  local_7f0 = local_7e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p == &local_810.field_2) {
    uStack_7d8 = local_810.field_2._8_8_;
  }
  else {
    local_7f0 = local_810._M_dataplus._M_p;
  }
  local_7e8 = local_810._M_string_length;
  local_810._M_string_length = 0;
  local_810.field_2._M_local_buf[0] = '\0';
  description_03._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/rawtransaction.cpp:1529:9)>
       ::_M_invoke;
  description_03._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/rawtransaction.cpp:1529:9)>
                ::_M_manager;
  description_03.field_2 = in_stack_fffffffffffff6d8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar6;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar5;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar7;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar8;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff700;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar9;
  examples.m_examples._M_string_length = in_stack_fffffffffffff720;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar10;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar11;
  examples.m_examples.field_2._8_8_ = pRVar12;
  fun.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffff740;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar13;
  fun.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffff748._0_8_;
  fun._M_invoker = (_Invoker_type)in_stack_fffffffffffff748._8_8_;
  local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff6b0,&stack0xfffffffffffff6b8)),
             description_03,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff6b8);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::__cxx11::string::~string((string *)&local_810);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::~string((string *)&local_830);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff770);
  RPCResult::~RPCResult(&local_538);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff750);
  lVar3 = 0x110;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_710[0].m_type + lVar3));
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff6e8);
  std::__cxx11::string::~string(local_7d0);
  std::__cxx11::string::~string(local_7b0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff708);
  std::__cxx11::string::~string(local_790);
  std::__cxx11::string::~string(local_770);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff728);
  std::__cxx11::string::~string(local_750);
  std::__cxx11::string::~string(local_730);
  std::__cxx11::string::~string(local_578);
  std::__cxx11::string::~string(local_558);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_870);
  lVar3 = 0x108;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_288[0].m_names._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x108;
  } while (lVar3 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_4b0);
  std::__cxx11::string::~string(local_468);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_3f0);
  UniValue::~UniValue(&local_448);
  std::__cxx11::string::~string(local_390);
  RPCArgOptions::~RPCArgOptions(&local_370);
  std::__cxx11::string::~string(local_328);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_308._M_first);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan finalizepsbt()
{
    return RPCHelpMan{"finalizepsbt",
                "Finalize the inputs of a PSBT. If the transaction is fully signed, it will produce a\n"
                "network serialized transaction which can be broadcast with sendrawtransaction. Otherwise a PSBT will be\n"
                "created which has the final_scriptSig and final_scriptWitness fields filled for inputs that are complete.\n"
                "Implements the Finalizer and Extractor roles.\n",
                {
                    {"psbt", RPCArg::Type::STR, RPCArg::Optional::NO, "A base64 string of a PSBT"},
                    {"extract", RPCArg::Type::BOOL, RPCArg::Default{true}, "If true and the transaction is complete,\n"
            "                             extract and return the complete transaction in normal network serialization instead of the PSBT."},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR, "psbt", /*optional=*/true, "The base64-encoded partially signed transaction if not extracted"},
                        {RPCResult::Type::STR_HEX, "hex", /*optional=*/true, "The hex-encoded network transaction if extracted"},
                        {RPCResult::Type::BOOL, "complete", "If the transaction has a complete set of signatures"},
                    }
                },
                RPCExamples{
                    HelpExampleCli("finalizepsbt", "\"psbt\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    // Unserialize the transactions
    PartiallySignedTransaction psbtx;
    std::string error;
    if (!DecodeBase64PSBT(psbtx, request.params[0].get_str(), error)) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("TX decode failed %s", error));
    }

    bool extract = request.params[1].isNull() || (!request.params[1].isNull() && request.params[1].get_bool());

    CMutableTransaction mtx;
    bool complete = FinalizeAndExtractPSBT(psbtx, mtx);

    UniValue result(UniValue::VOBJ);
    DataStream ssTx{};
    std::string result_str;

    if (complete && extract) {
        ssTx << TX_WITH_WITNESS(mtx);
        result_str = HexStr(ssTx);
        result.pushKV("hex", result_str);
    } else {
        ssTx << psbtx;
        result_str = EncodeBase64(ssTx.str());
        result.pushKV("psbt", result_str);
    }
    result.pushKV("complete", complete);

    return result;
},
    };
}